

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::addTag(TranslateToFuzzReader *this)

{
  Module *module;
  Type TVar1;
  Name root;
  Signature SVar2;
  IString IVar3;
  HeapType local_38;
  IString *local_30;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  
  module = this->wasm;
  root.super_IString.str = (IString)wasm::IString::interned(4,"tag$",0);
  IVar3.str = (string_view)Names::getValidTagName(module,root);
  TVar1 = getControlFlowType(this);
  SVar2.results.id = 0;
  SVar2.params.id = TVar1.id;
  wasm::HeapType::HeapType(&local_38,SVar2);
  local_30 = (IString *)operator_new(0x40);
  local_30[3].str._M_len = 0;
  *(char **)((long)(local_30 + 3) + 8) = (char *)0x0;
  (local_30->str)._M_len = 0;
  *(char **)((long)&local_30->str + 8) = (char *)0x0;
  local_30[1].str._M_len = 0;
  *(char **)((long)(local_30 + 1) + 8) = (char *)0x0;
  local_30[2].str._M_len = 0;
  *(char **)((long)(local_30 + 2) + 8) = (char *)0x0;
  *(char **)((long)(local_30 + 3) + 8) = (char *)0x10;
  local_30->str = IVar3.str;
  *(uintptr_t *)((long)(local_30 + 3) + 8) = local_38.id;
  wasm::Module::addTag((unique_ptr *)this->wasm);
  if (local_30 != (IString *)0x0) {
    operator_delete(local_30,0x40);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addTag() {
  auto tag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                             Signature(getControlFlowType(), Type::none));
  wasm.addTag(std::move(tag));
}